

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::SwitchMixin<(unsigned_char)'\b'>::AddCase
          (SwitchMixin<(unsigned_char)__b_> *this,char16 c,Label targetLabel)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte local_1a;
  byte local_19;
  uint8 j;
  uint8 i;
  Label targetLabel_local;
  char16 c_local;
  SwitchMixin<(unsigned_char)__b_> *this_local;
  
  if (7 < this->numCases) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x38c,"(numCases < MaxCases)","numCases < MaxCases");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  for (local_19 = 0; local_19 < this->numCases; local_19 = local_19 + 1) {
    if (this->cases[local_19].c == c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x390,"(cases[i].c != c)","cases[i].c != c");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if ((ushort)c < (ushort)this->cases[local_19].c) break;
  }
  for (local_1a = this->numCases; local_19 < local_1a; local_1a = local_1a - 1) {
    *(undefined4 *)(this->cases + local_1a) = *(undefined4 *)(this->cases + (int)(local_1a - 1));
    *(undefined2 *)((long)&this->cases[local_1a].targetLabel + 2) =
         *(undefined2 *)((long)&this->cases[(int)(local_1a - 1)].targetLabel + 2);
  }
  this->cases[local_19].c = c;
  this->cases[local_19].targetLabel = targetLabel;
  this->numCases = this->numCases + '\x01';
  return;
}

Assistant:

void SwitchMixin<n>::AddCase(char16 c, Label targetLabel)
    {
        AnalysisAssert(numCases < MaxCases);
        uint8 i;
        for (i = 0; i < numCases; i++)
        {
            Assert(cases[i].c != c);
            if (cases[i].c > c)
            {
                break;
            }
        }
        __analysis_assume(numCases < MaxCases);
        for (uint8 j = numCases; j > i; j--)
        {
            cases[j] = cases[j - 1];
        }
        cases[i].c = c;
        cases[i].targetLabel = targetLabel;
        numCases++;
    }